

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::ApplyReflect<1,_float,_float,_float>::apply
          (ApplyReflect<1,_float,_float,_float> *this,ExpandContext *param_1,ExprP<float> *i,
          ExprP<float> *n)

{
  ExprP<float> *pEVar1;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar2;
  float local_12c;
  ExprP<float> local_128;
  ExprP<float> local_118;
  ExprP<float> local_108;
  ExprP<float> local_f8;
  float local_e4;
  ExprP<float> local_e0;
  ExprP<float> local_d0;
  ExprP<float> local_c0;
  ExprP<float> local_b0;
  float local_9c;
  ExprP<float> local_98 [2];
  ExprP<float> local_78;
  ExprP<float> local_68;
  ExprP<float> local_58;
  ExprP<float> local_48;
  ExprP<float> local_38;
  ExprP<float> *local_28;
  ExprP<float> *n_local;
  ExprP<float> *i_local;
  ExpandContext *param_0_local;
  
  local_28 = n;
  n_local = i;
  i_local = (ExprP<float> *)param_1;
  param_0_local = (ExpandContext *)this;
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_78,n,i);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_68,n,&local_78);
  local_9c = 2.0;
  constant<float>((BuiltinPrecisionTests *)local_98,&local_9c);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_58,&local_68,local_98);
  pEVar1 = local_28;
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_d0,local_28,n_local);
  local_e4 = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_e0,&local_e4);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_c0,&local_d0,&local_e0);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_b0,pEVar1,&local_c0);
  alternatives<float>((BuiltinPrecisionTests *)&local_48,&local_58,&local_b0);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_108,local_28,local_28);
  pEVar1 = n_local;
  local_12c = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_128,&local_12c);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_118,pEVar1,&local_128);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_f8,&local_108,&local_118);
  alternatives<float>((BuiltinPrecisionTests *)&local_38,&local_48,&local_f8);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)this,i,&local_38);
  ExprP<float>::~ExprP(&local_38);
  ExprP<float>::~ExprP(&local_f8);
  ExprP<float>::~ExprP(&local_118);
  ExprP<float>::~ExprP(&local_128);
  ExprP<float>::~ExprP(&local_108);
  ExprP<float>::~ExprP(&local_48);
  ExprP<float>::~ExprP(&local_b0);
  ExprP<float>::~ExprP(&local_c0);
  ExprP<float>::~ExprP(&local_e0);
  ExprP<float>::~ExprP(&local_d0);
  ExprP<float>::~ExprP(&local_58);
  ExprP<float>::~ExprP(local_98);
  ExprP<float>::~ExprP(&local_68);
  ExprP<float>::~ExprP(&local_78);
  EVar2.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar2.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar2.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

static ExprP<Ret> apply	(ExpandContext&,
							 const ExprP<Arg0>&	i,
							 const ExprP<Arg1>&	n)
	{
		return i - alternatives(alternatives((n * (n*i)) * constant(2.0f),
											n * ((n*i) * constant(2.0f))),
											(n * n) * (i * constant(2.0f)));
	}